

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Normal3f __thiscall
pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Normal3f *n,Float time)

{
  Tuple3<pbrt::Normal3,_float> TVar1;
  Transform t;
  Transform local_90;
  
  if ((this->actuallyAnimated == true) && (this->startTime < time)) {
    if (time < this->endTime) {
      Interpolate(&local_90,this,time);
      TVar1 = (Tuple3<pbrt::Normal3,_float>)Transform::operator()(&local_90,n);
      return (Normal3f)TVar1;
    }
    this = (AnimatedTransform *)&this->endTransform;
  }
  TVar1 = (Tuple3<pbrt::Normal3,_float>)Transform::operator()(&this->startTransform,n);
  return (Normal3f)TVar1;
}

Assistant:

Normal3f AnimatedTransform::operator()(const Normal3f &n, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(n);
    else if (time >= endTime)
        return endTransform(n);
    Transform t = Interpolate(time);
    return t(n);
}